

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_doubleFast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  U32 UVar1;
  U32 UVar2;
  U32 *pUVar3;
  U32 *pUVar4;
  BYTE *pBVar5;
  int iVar6;
  int iVar7;
  U32 UVar8;
  U32 UVar9;
  U32 UVar10;
  uint uVar11;
  U32 UVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  BYTE *pBVar20;
  BYTE *pBVar21;
  U64 UVar22;
  U64 UVar23;
  size_t sVar24;
  size_t sVar25;
  BYTE *pBVar26;
  BYTE *pBVar27;
  ulong uVar28;
  bool bVar29;
  BYTE *local_d50;
  BYTE *local_d40;
  BYTE *local_cd0;
  BYTE *local_cb8;
  BYTE *local_ca0;
  BYTE *local_c88;
  BYTE *local_c70;
  BYTE *local_c60;
  BYTE *local_c58;
  BYTE *local_c48;
  uint local_c34;
  uint local_c30;
  uint local_a70;
  U32 tmpOffset_1;
  size_t repLength2_1;
  BYTE *repEnd2_1;
  BYTE *repMatch2_1;
  U32 repIndex2_1;
  U32 current2_1;
  U32 indexToInsert_1;
  BYTE *lowMatchPtr_2;
  BYTE *matchEnd_2;
  BYTE *lowMatchPtr_1;
  BYTE *matchEnd_1;
  BYTE *pBStack_a18;
  U32 offset_4;
  BYTE *match3;
  BYTE *match3Base;
  U32 matchIndex3;
  size_t h3;
  U32 offset_3;
  BYTE *lowMatchPtr;
  BYTE *matchEnd;
  BYTE *repMatchEnd_1;
  size_t mLength_1;
  BYTE *repMatch_1;
  BYTE *repBase;
  U32 repIndex_1;
  U32 curr_2;
  BYTE *matchLong_1;
  BYTE *matchLongBase;
  U32 matchLongIndex;
  size_t hLong;
  BYTE *match_1;
  BYTE *matchBase;
  U32 matchIndex;
  size_t hSmall;
  U32 offset_2;
  U32 offset_1;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  BYTE *prefixStart;
  U32 prefixStartIndex;
  U32 dictLimit;
  U32 dictStartIndex;
  U32 lowLimit;
  U32 endIndex;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  U32 hBitsS;
  U32 *hashSmall;
  U32 hBitsL;
  U32 *hashLong;
  ZSTD_compressionParameters *cParams;
  U32 mls_local;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  size_t local_880;
  size_t local_868;
  size_t local_850;
  size_t local_7d8;
  U32 tmpOff;
  size_t rLength;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  U32 indexToInsert;
  BYTE *dictMatchL3;
  BYTE *pBStack_780;
  U32 dictMatchIndexL3;
  BYTE *matchL3;
  U32 matchIndexL3;
  size_t dictHLNext;
  size_t hl3;
  U32 dictMatchIndexS;
  BYTE *dictMatchL;
  U32 dictMatchIndexL;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  BYTE *pBStack_730;
  U32 repIndex;
  BYTE *match;
  BYTE *matchLong;
  U32 matchIndexS;
  U32 matchIndexL;
  U32 curr_1;
  size_t dictHS;
  size_t dictHL;
  size_t h;
  size_t h2;
  long lStack_6e8;
  U32 offset;
  size_t mLength;
  U32 maxRep;
  U32 windowLow;
  U32 curr;
  U32 dictAndPrefixLength;
  U32 dictHBitsS;
  U32 dictHBitsL;
  U32 dictIndexDelta;
  BYTE *dictEnd_1;
  BYTE *dictStart_1;
  BYTE *dictBase_1;
  U32 dictStartIndex_1;
  U32 *dictHashSmall;
  U32 *dictHashLong;
  ZSTD_compressionParameters *dictCParams;
  ZSTD_matchState_t *dms;
  uint local_678;
  U32 offsetSaved;
  U32 offset_2_1;
  U32 offset_1_1;
  BYTE *ilimit_1;
  BYTE *iend_1;
  BYTE *prefixLowest;
  U32 prefixLowestIndex;
  U32 endIndex_1;
  BYTE *anchor_1;
  BYTE *ip_1;
  BYTE *istart_1;
  BYTE *base_1;
  U32 hBitsS_1;
  U32 *hashSmall_1;
  U32 hBitsL_1;
  U32 *hashLong_1;
  ZSTD_compressionParameters *cParams_1;
  size_t local_5b0;
  size_t local_568;
  size_t local_550;
  size_t local_4a8;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  BYTE *litEnd_3;
  BYTE *litLimit_w_3;
  BYTE *litEnd_4;
  BYTE *litLimit_w_4;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  BYTE *litEnd_8;
  BYTE *litLimit_w_8;
  BYTE *litEnd_7;
  BYTE *litLimit_w_7;
  BYTE *litEnd_6;
  BYTE *litLimit_w_6;
  BYTE *litEnd_5;
  BYTE *litLimit_w_5;
  BYTE *oend_5;
  BYTE *op_5;
  BYTE *ip_7;
  ptrdiff_t diff_5;
  BYTE *oend_6;
  BYTE *op_6;
  BYTE *ip_8;
  ptrdiff_t diff_6;
  BYTE *oend_7;
  BYTE *op_7;
  BYTE *ip_9;
  ptrdiff_t diff_7;
  BYTE *oend_8;
  BYTE *op_8;
  BYTE *ip_10;
  ptrdiff_t diff_8;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_4;
  ptrdiff_t diff_2;
  BYTE *oend_4;
  BYTE *op_4;
  BYTE *ip_6;
  ptrdiff_t diff_4;
  BYTE *oend_3;
  BYTE *op_3;
  BYTE *ip_5;
  ptrdiff_t diff_3;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_3;
  ptrdiff_t diff_1;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_2;
  ptrdiff_t diff;
  
  pUVar3 = ms->hashTable;
  UVar1 = (ms->cParams).hashLog;
  pUVar4 = ms->chainTable;
  UVar2 = (ms->cParams).chainLog;
  pBVar16 = (BYTE *)((long)src + srcSize);
  pBVar17 = pBVar16 + -8;
  pBVar5 = (ms->window).base;
  iVar7 = (int)pBVar5;
  iVar6 = (int)src;
  UVar8 = ZSTD_getLowestMatchIndex(ms,(iVar6 - iVar7) + (int)srcSize,(ms->cParams).windowLog);
  uVar13 = (ms->window).dictLimit;
  local_a70 = UVar8;
  if (UVar8 < uVar13) {
    local_a70 = uVar13;
  }
  pBVar18 = pBVar5 + local_a70;
  pBVar21 = (ms->window).dictBase;
  pBVar19 = pBVar21 + UVar8;
  pBVar20 = pBVar21 + local_a70;
  hSmall._4_4_ = *rep;
  hSmall._0_4_ = rep[1];
  iend = (BYTE *)src;
  anchor = (BYTE *)src;
  if (local_a70 == UVar8) {
    pUVar3 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar4 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar5 = (ms->window).base;
    iVar7 = (int)pBVar5;
    UVar8 = ZSTD_getLowestPrefixIndex(ms,(iVar6 - iVar7) + (int)srcSize,(ms->cParams).windowLog);
    pBVar16 = pBVar5 + UVar8;
    pBVar17 = (BYTE *)((long)src + srcSize);
    pBVar21 = pBVar17 + -8;
    uVar13 = *rep;
    uVar15 = rep[1];
    dms._4_4_ = 0;
    anchor_1 = (BYTE *)((long)src + (long)(int)(uint)(iVar6 == (int)pBVar16));
    UVar9 = (int)anchor_1 - iVar7;
    UVar10 = ZSTD_getLowestPrefixIndex(ms,UVar9,(ms->cParams).windowLog);
    uVar11 = UVar9 - UVar10;
    local_678 = uVar15;
    if (uVar11 < uVar15) {
      local_678 = 0;
      dms._4_4_ = uVar15;
    }
    offsetSaved = uVar13;
    _prefixLowestIndex = (BYTE *)src;
    if (uVar11 < uVar13) {
      offsetSaved = 0;
      dms._4_4_ = uVar13;
    }
    while (anchor_1 < pBVar21) {
      sVar24 = ZSTD_hash8Ptr(anchor_1,UVar1);
      switch(mls) {
      default:
        local_4a8 = ZSTD_hash4Ptr(anchor_1,UVar2);
        break;
      case 5:
        local_4a8 = ZSTD_hash5Ptr(anchor_1,UVar2);
        break;
      case 6:
        local_4a8 = ZSTD_hash6Ptr(anchor_1,UVar2);
        break;
      case 7:
        local_4a8 = ZSTD_hash7Ptr(anchor_1,UVar2);
        break;
      case 8:
        local_4a8 = ZSTD_hash8Ptr(anchor_1,UVar2);
      }
      ZSTD_hash8Ptr(anchor_1,UVar1);
      switch(mls) {
      default:
        ZSTD_hash4Ptr(anchor_1,UVar2);
        break;
      case 5:
        ZSTD_hash5Ptr(anchor_1,UVar2);
        break;
      case 6:
        ZSTD_hash6Ptr(anchor_1,UVar2);
        break;
      case 7:
        ZSTD_hash7Ptr(anchor_1,UVar2);
        break;
      case 8:
        ZSTD_hash8Ptr(anchor_1,UVar2);
      }
      iVar6 = (int)anchor_1;
      UVar9 = iVar6 - iVar7;
      uVar13 = pUVar3[sVar24];
      uVar15 = pUVar4[local_4a8];
      match = pBVar5 + uVar13;
      pBStack_730 = pBVar5 + uVar15;
      pUVar4[local_4a8] = UVar9;
      pUVar3[sVar24] = UVar9;
      UVar10 = MEM_read32(anchor_1 + (1 - (ulong)offsetSaved));
      UVar12 = MEM_read32(anchor_1 + 1);
      if (offsetSaved == 0 || UVar10 != UVar12) {
        if (UVar8 < uVar13) {
          UVar22 = MEM_read64(match);
          UVar23 = MEM_read64(anchor_1);
          if (UVar22 != UVar23) goto LAB_0026bbc7;
          sVar24 = ZSTD_count(anchor_1 + 8,match + 8,pBVar17);
          lStack_6e8 = sVar24 + 8;
          h2._4_4_ = iVar6 - (int)match;
          while( true ) {
            bVar29 = false;
            if (_prefixLowestIndex < anchor_1 && pBVar16 < match) {
              bVar29 = anchor_1[-1] == match[-1];
            }
            if (!bVar29) break;
            anchor_1 = anchor_1 + -1;
            match = match + -1;
            lStack_6e8 = lStack_6e8 + 1;
          }
LAB_0026c3c1:
          local_678 = offsetSaved;
          offsetSaved = h2._4_4_;
          uVar28 = (long)anchor_1 - (long)_prefixLowestIndex;
          if (pBVar17 + -0x20 < _prefixLowestIndex + uVar28) {
            ZSTD_safecopyLiterals
                      (seqStore->lit,_prefixLowestIndex,_prefixLowestIndex + uVar28,pBVar17 + -0x20)
            ;
          }
          else {
            ZSTD_copy16(seqStore->lit,_prefixLowestIndex);
            if (0x10 < uVar28) {
              pBVar18 = seqStore->lit;
              pBVar19 = pBVar18 + 0x10;
              ZSTD_copy16(pBVar19,_prefixLowestIndex + 0x10);
              if (0x10 < (long)(uVar28 - 0x10)) {
                oend_2 = pBVar18 + 0x20;
                do {
                  op_2 = _prefixLowestIndex + 0x20;
                  ZSTD_copy16(oend_2,op_2);
                  ZSTD_copy16(oend_2 + 0x10,_prefixLowestIndex + 0x30);
                  oend_2 = oend_2 + 0x20;
                  _prefixLowestIndex = op_2;
                } while (oend_2 < pBVar19 + (uVar28 - 0x10));
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar28;
          if (0xffff < uVar28) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->litLength = (U16)uVar28;
          seqStore->sequences->offset = h2._4_4_ + 3;
          if (0xffff < lStack_6e8 - 3U) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->matchLength = (U16)(lStack_6e8 - 3U);
          seqStore->sequences = seqStore->sequences + 1;
          goto LAB_0026c774;
        }
LAB_0026bbc7:
        if (UVar8 < uVar15) {
          UVar10 = MEM_read32(pBStack_730);
          UVar12 = MEM_read32(anchor_1);
          if (UVar10 == UVar12) {
            sVar24 = ZSTD_hash8Ptr(anchor_1 + 1,UVar1);
            ZSTD_hash8Ptr(anchor_1 + 1,UVar1);
            uVar13 = pUVar3[sVar24];
            pBStack_780 = pBVar5 + uVar13;
            pUVar3[sVar24] = UVar9 + 1;
            if (UVar8 < uVar13) {
              UVar22 = MEM_read64(pBStack_780);
              UVar23 = MEM_read64(anchor_1 + 1);
              if (UVar22 == UVar23) {
                sVar24 = ZSTD_count(anchor_1 + 9,pBStack_780 + 8,pBVar17);
                lStack_6e8 = sVar24 + 8;
                anchor_1 = anchor_1 + 1;
                h2._4_4_ = (int)anchor_1 - (int)pBStack_780;
                while( true ) {
                  bVar29 = false;
                  if (_prefixLowestIndex < anchor_1 && pBVar16 < pBStack_780) {
                    bVar29 = anchor_1[-1] == pBStack_780[-1];
                  }
                  if (!bVar29) break;
                  anchor_1 = anchor_1 + -1;
                  pBStack_780 = pBStack_780 + -1;
                  lStack_6e8 = lStack_6e8 + 1;
                }
                goto LAB_0026c3c1;
              }
            }
            sVar24 = ZSTD_count(anchor_1 + 4,pBStack_730 + 4,pBVar17);
            lStack_6e8 = sVar24 + 4;
            h2._4_4_ = iVar6 - (int)pBStack_730;
            while( true ) {
              bVar29 = false;
              if (_prefixLowestIndex < anchor_1 && pBVar16 < pBStack_730) {
                bVar29 = anchor_1[-1] == pBStack_730[-1];
              }
              if (!bVar29) break;
              anchor_1 = anchor_1 + -1;
              pBStack_730 = pBStack_730 + -1;
              lStack_6e8 = lStack_6e8 + 1;
            }
            goto LAB_0026c3c1;
          }
        }
        anchor_1 = anchor_1 + ((long)anchor_1 - (long)_prefixLowestIndex >> 8) + 1;
      }
      else {
        sVar24 = ZSTD_count(anchor_1 + 5,anchor_1 + (5 - (ulong)offsetSaved),pBVar17);
        lStack_6e8 = sVar24 + 4;
        anchor_1 = anchor_1 + 1;
        uVar28 = (long)anchor_1 - (long)_prefixLowestIndex;
        if (pBVar17 + -0x20 < _prefixLowestIndex + uVar28) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_prefixLowestIndex,_prefixLowestIndex + uVar28,pBVar17 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_prefixLowestIndex);
          if (0x10 < uVar28) {
            pBVar18 = seqStore->lit;
            pBVar19 = pBVar18 + 0x10;
            ZSTD_copy16(pBVar19,_prefixLowestIndex + 0x10);
            if (0x10 < (long)(uVar28 - 0x10)) {
              oend_1 = pBVar18 + 0x20;
              do {
                op_1 = _prefixLowestIndex + 0x20;
                ZSTD_copy16(oend_1,op_1);
                ZSTD_copy16(oend_1 + 0x10,_prefixLowestIndex + 0x30);
                oend_1 = oend_1 + 0x20;
                _prefixLowestIndex = op_1;
              } while (oend_1 < pBVar19 + (uVar28 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar28;
        if (0xffff < uVar28) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar28;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar24 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar24 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_0026c774:
        _prefixLowestIndex = anchor_1 + lStack_6e8;
        anchor_1 = _prefixLowestIndex;
        if (_prefixLowestIndex <= pBVar21) {
          uVar13 = UVar9 + 2;
          sVar24 = ZSTD_hash8Ptr(pBVar5 + uVar13,UVar1);
          pUVar3[sVar24] = uVar13;
          sVar24 = ZSTD_hash8Ptr(_prefixLowestIndex + -2,UVar1);
          pUVar3[sVar24] = (int)(_prefixLowestIndex + -2) - iVar7;
          pBVar18 = pBVar5 + uVar13;
          switch(mls) {
          default:
            local_550 = ZSTD_hash4Ptr(pBVar18,UVar2);
            break;
          case 5:
            local_550 = ZSTD_hash5Ptr(pBVar18,UVar2);
            break;
          case 6:
            local_550 = ZSTD_hash6Ptr(pBVar18,UVar2);
            break;
          case 7:
            local_550 = ZSTD_hash7Ptr(pBVar18,UVar2);
            break;
          case 8:
            local_550 = ZSTD_hash8Ptr(pBVar18,UVar2);
          }
          pUVar4[local_550] = uVar13;
          _prefixLowestIndex = _prefixLowestIndex + -1;
          switch(mls) {
          default:
            local_568 = ZSTD_hash4Ptr(_prefixLowestIndex,UVar2);
            break;
          case 5:
            local_568 = ZSTD_hash5Ptr(_prefixLowestIndex,UVar2);
            break;
          case 6:
            local_568 = ZSTD_hash6Ptr(_prefixLowestIndex,UVar2);
            break;
          case 7:
            local_568 = ZSTD_hash7Ptr(_prefixLowestIndex,UVar2);
            break;
          case 8:
            local_568 = ZSTD_hash8Ptr(_prefixLowestIndex,UVar2);
          }
          pUVar4[local_568] = (int)_prefixLowestIndex - iVar7;
          while( true ) {
            uVar13 = local_678;
            bVar29 = false;
            if (anchor_1 <= pBVar21) {
              UVar9 = MEM_read32(anchor_1);
              UVar10 = MEM_read32(anchor_1 + -(ulong)local_678);
              bVar29 = local_678 != 0 && UVar9 == UVar10;
            }
            _prefixLowestIndex = anchor_1;
            if (!bVar29) break;
            sVar24 = ZSTD_count(anchor_1 + 4,anchor_1 + 4 + -(ulong)local_678,pBVar17);
            local_678 = offsetSaved;
            offsetSaved = uVar13;
            switch(mls) {
            default:
              local_5b0 = ZSTD_hash4Ptr(anchor_1,UVar2);
              break;
            case 5:
              local_5b0 = ZSTD_hash5Ptr(anchor_1,UVar2);
              break;
            case 6:
              local_5b0 = ZSTD_hash6Ptr(anchor_1,UVar2);
              break;
            case 7:
              local_5b0 = ZSTD_hash7Ptr(anchor_1,UVar2);
              break;
            case 8:
              local_5b0 = ZSTD_hash8Ptr(anchor_1,UVar2);
            }
            pUVar4[local_5b0] = (int)anchor_1 - iVar7;
            sVar25 = ZSTD_hash8Ptr(anchor_1,UVar1);
            pUVar3[sVar25] = (int)anchor_1 - iVar7;
            if (pBVar17 + -0x20 < anchor_1) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_1,anchor_1,pBVar17 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_1);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar24 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar24 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            anchor_1 = anchor_1 + sVar24 + 4;
          }
        }
      }
    }
    if (offsetSaved == 0) {
      local_c30 = dms._4_4_;
    }
    else {
      local_c30 = offsetSaved;
    }
    *rep = local_c30;
    if (local_678 == 0) {
      local_c34 = dms._4_4_;
    }
    else {
      local_c34 = local_678;
    }
    rep[1] = local_c34;
    ms_local = (ZSTD_matchState_t *)(pBVar17 + -(long)_prefixLowestIndex);
  }
  else {
LAB_0026daa5:
    uVar13 = hSmall._4_4_;
    if (anchor < pBVar17) {
      switch(mls) {
      default:
        local_7d8 = ZSTD_hash4Ptr(anchor,UVar2);
        break;
      case 5:
        local_7d8 = ZSTD_hash5Ptr(anchor,UVar2);
        break;
      case 6:
        local_7d8 = ZSTD_hash6Ptr(anchor,UVar2);
        break;
      case 7:
        local_7d8 = ZSTD_hash7Ptr(anchor,UVar2);
        break;
      case 8:
        local_7d8 = ZSTD_hash8Ptr(anchor,UVar2);
      }
      uVar15 = pUVar4[local_7d8];
      local_c48 = pBVar5;
      if (uVar15 < local_a70) {
        local_c48 = pBVar21;
      }
      hLong = (size_t)(local_c48 + uVar15);
      sVar24 = ZSTD_hash8Ptr(anchor,UVar1);
      uVar11 = pUVar3[sVar24];
      local_c58 = pBVar5;
      if (uVar11 < local_a70) {
        local_c58 = pBVar21;
      }
      _repIndex_1 = local_c58 + uVar11;
      UVar9 = (int)anchor - iVar7;
      uVar14 = (UVar9 + 1) - hSmall._4_4_;
      local_c60 = pBVar5;
      if (uVar14 < local_a70) {
        local_c60 = pBVar21;
      }
      pUVar3[sVar24] = UVar9;
      pUVar4[local_7d8] = UVar9;
      if ((local_a70 - 1) - uVar14 < 3 || (UVar9 + 1) - UVar8 <= hSmall._4_4_) {
LAB_0026e29b:
        if (UVar8 < uVar11) {
          UVar22 = MEM_read64(_repIndex_1);
          UVar23 = MEM_read64(anchor);
          if (UVar22 != UVar23) goto LAB_0026e7fb;
          local_c88 = pBVar18;
          pBVar27 = pBVar16;
          if (uVar11 < local_a70) {
            local_c88 = pBVar19;
            pBVar27 = pBVar20;
          }
          sVar24 = ZSTD_count_2segments(anchor + 8,_repIndex_1 + 8,pBVar16,pBVar27,pBVar18);
          repMatchEnd_1 = (BYTE *)(sVar24 + 8);
          hSmall._4_4_ = UVar9 - uVar11;
          while( true ) {
            bVar29 = false;
            if (iend < anchor && local_c88 < _repIndex_1) {
              bVar29 = anchor[-1] == _repIndex_1[-1];
            }
            if (!bVar29) break;
            anchor = anchor + -1;
            _repIndex_1 = _repIndex_1 + -1;
            repMatchEnd_1 = repMatchEnd_1 + 1;
          }
          uVar28 = (long)anchor - (long)iend;
          if (pBVar16 + -0x20 < iend + uVar28) {
            ZSTD_safecopyLiterals(seqStore->lit,iend,iend + uVar28,pBVar16 + -0x20);
          }
          else {
            ZSTD_copy16(seqStore->lit,iend);
            if (0x10 < uVar28) {
              pBVar27 = seqStore->lit;
              pBVar26 = pBVar27 + 0x10;
              ZSTD_copy16(pBVar26,iend + 0x10);
              if (0x10 < (long)(uVar28 - 0x10)) {
                oend_6 = pBVar27 + 0x20;
                do {
                  op_6 = iend + 0x20;
                  ZSTD_copy16(oend_6,op_6);
                  ZSTD_copy16(oend_6 + 0x10,iend + 0x30);
                  oend_6 = oend_6 + 0x20;
                  iend = op_6;
                } while (oend_6 < pBVar26 + (uVar28 - 0x10));
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar28;
          if (0xffff < uVar28) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->litLength = (U16)uVar28;
          seqStore->sequences->offset = hSmall._4_4_ + 3;
          if ((BYTE *)0xffff < repMatchEnd_1 + -3) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->matchLength = (U16)(repMatchEnd_1 + -3);
          seqStore->sequences = seqStore->sequences + 1;
LAB_0026f0b6:
          hSmall._0_4_ = uVar13;
          goto LAB_0026f0b8;
        }
LAB_0026e7fb:
        if (UVar8 < uVar15) {
          UVar10 = MEM_read32((void *)hLong);
          UVar12 = MEM_read32(anchor);
          if (UVar10 == UVar12) {
            sVar24 = ZSTD_hash8Ptr(anchor + 1,UVar1);
            uVar11 = pUVar3[sVar24];
            local_ca0 = pBVar5;
            if (uVar11 < local_a70) {
              local_ca0 = pBVar21;
            }
            pBStack_a18 = local_ca0 + uVar11;
            pUVar3[sVar24] = UVar9 + 1;
            if (UVar8 < uVar11) {
              UVar22 = MEM_read64(pBStack_a18);
              UVar23 = MEM_read64(anchor + 1);
              if (UVar22 != UVar23) goto LAB_0026eb6d;
              local_cb8 = pBVar18;
              pBVar27 = pBVar16;
              if (uVar11 < local_a70) {
                local_cb8 = pBVar19;
                pBVar27 = pBVar20;
              }
              sVar24 = ZSTD_count_2segments(anchor + 9,pBStack_a18 + 8,pBVar16,pBVar27,pBVar18);
              repMatchEnd_1 = (BYTE *)(sVar24 + 8);
              anchor = anchor + 1;
              matchEnd_1._4_4_ = (UVar9 + 1) - uVar11;
              while( true ) {
                bVar29 = false;
                if (iend < anchor && local_cb8 < pBStack_a18) {
                  bVar29 = anchor[-1] == pBStack_a18[-1];
                }
                if (!bVar29) break;
                anchor = anchor + -1;
                pBStack_a18 = pBStack_a18 + -1;
                repMatchEnd_1 = repMatchEnd_1 + 1;
              }
            }
            else {
LAB_0026eb6d:
              local_cd0 = pBVar18;
              pBVar27 = pBVar16;
              if (uVar15 < local_a70) {
                local_cd0 = pBVar19;
                pBVar27 = pBVar20;
              }
              sVar24 = ZSTD_count_2segments(anchor + 4,(BYTE *)(hLong + 4),pBVar16,pBVar27,pBVar18);
              repMatchEnd_1 = (BYTE *)(sVar24 + 4);
              matchEnd_1._4_4_ = UVar9 - uVar15;
              while( true ) {
                bVar29 = false;
                if (iend < anchor && local_cd0 < hLong) {
                  bVar29 = anchor[-1] == *(BYTE *)(hLong - 1);
                }
                if (!bVar29) break;
                anchor = anchor + -1;
                hLong = hLong - 1;
                repMatchEnd_1 = repMatchEnd_1 + 1;
              }
            }
            hSmall._4_4_ = matchEnd_1._4_4_;
            uVar28 = (long)anchor - (long)iend;
            if (pBVar16 + -0x20 < iend + uVar28) {
              ZSTD_safecopyLiterals(seqStore->lit,iend,iend + uVar28,pBVar16 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,iend);
              if (0x10 < uVar28) {
                pBVar27 = seqStore->lit;
                pBVar26 = pBVar27 + 0x10;
                ZSTD_copy16(pBVar26,iend + 0x10);
                if (0x10 < (long)(uVar28 - 0x10)) {
                  oend_7 = pBVar27 + 0x20;
                  do {
                    op_7 = iend + 0x20;
                    ZSTD_copy16(oend_7,op_7);
                    ZSTD_copy16(oend_7 + 0x10,iend + 0x30);
                    oend_7 = oend_7 + 0x20;
                    iend = op_7;
                  } while (oend_7 < pBVar26 + (uVar28 - 0x10));
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar28;
            if (0xffff < uVar28) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar28;
            seqStore->sequences->offset = matchEnd_1._4_4_ + 3;
            if ((BYTE *)0xffff < repMatchEnd_1 + -3) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(repMatchEnd_1 + -3);
            seqStore->sequences = seqStore->sequences + 1;
            goto LAB_0026f0b6;
          }
        }
        anchor = anchor + ((long)anchor - (long)iend >> 8) + 1;
      }
      else {
        UVar10 = MEM_read32(local_c60 + uVar14);
        UVar12 = MEM_read32(anchor + 1);
        if (UVar10 != UVar12) goto LAB_0026e29b;
        local_c70 = pBVar16;
        if (uVar14 < local_a70) {
          local_c70 = pBVar20;
        }
        sVar24 = ZSTD_count_2segments(anchor + 5,local_c60 + uVar14 + 4,pBVar16,local_c70,pBVar18);
        repMatchEnd_1 = (BYTE *)(sVar24 + 4);
        anchor = anchor + 1;
        uVar28 = (long)anchor - (long)iend;
        if (pBVar16 + -0x20 < iend + uVar28) {
          ZSTD_safecopyLiterals(seqStore->lit,iend,iend + uVar28,pBVar16 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,iend);
          if (0x10 < uVar28) {
            pBVar27 = seqStore->lit;
            pBVar26 = pBVar27 + 0x10;
            ZSTD_copy16(pBVar26,iend + 0x10);
            if (0x10 < (long)(uVar28 - 0x10)) {
              oend_5 = pBVar27 + 0x20;
              do {
                op_5 = iend + 0x20;
                ZSTD_copy16(oend_5,op_5);
                ZSTD_copy16(oend_5 + 0x10,iend + 0x30);
                oend_5 = oend_5 + 0x20;
                iend = op_5;
              } while (oend_5 < pBVar26 + (uVar28 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar28;
        if (0xffff < uVar28) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar28;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar24 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar24 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_0026f0b8:
        iend = repMatchEnd_1 + (long)anchor;
        anchor = iend;
        if (iend <= pBVar17) {
          uVar13 = UVar9 + 2;
          sVar24 = ZSTD_hash8Ptr(pBVar5 + uVar13,UVar1);
          pUVar3[sVar24] = uVar13;
          sVar24 = ZSTD_hash8Ptr(iend + -2,UVar1);
          pUVar3[sVar24] = (int)(iend + -2) - iVar7;
          pBVar27 = pBVar5 + uVar13;
          switch(mls) {
          default:
            local_850 = ZSTD_hash4Ptr(pBVar27,UVar2);
            break;
          case 5:
            local_850 = ZSTD_hash5Ptr(pBVar27,UVar2);
            break;
          case 6:
            local_850 = ZSTD_hash6Ptr(pBVar27,UVar2);
            break;
          case 7:
            local_850 = ZSTD_hash7Ptr(pBVar27,UVar2);
            break;
          case 8:
            local_850 = ZSTD_hash8Ptr(pBVar27,UVar2);
          }
          pUVar4[local_850] = uVar13;
          pBVar27 = iend + -1;
          switch(mls) {
          default:
            local_868 = ZSTD_hash4Ptr(pBVar27,UVar2);
            break;
          case 5:
            local_868 = ZSTD_hash5Ptr(pBVar27,UVar2);
            break;
          case 6:
            local_868 = ZSTD_hash6Ptr(pBVar27,UVar2);
            break;
          case 7:
            local_868 = ZSTD_hash7Ptr(pBVar27,UVar2);
            break;
          case 8:
            local_868 = ZSTD_hash8Ptr(pBVar27,UVar2);
          }
          pUVar4[local_868] = (int)pBVar27 - iVar7;
          for (; uVar13 = (U32)hSmall, iend = anchor, anchor <= pBVar17;
              anchor = anchor + sVar24 + 4) {
            UVar9 = (int)anchor - iVar7;
            uVar15 = UVar9 - (U32)hSmall;
            if (uVar15 < local_a70) {
              local_d40 = pBVar21 + uVar15;
            }
            else {
              local_d40 = pBVar5 + uVar15;
            }
            if ((local_a70 - 1) - uVar15 < 3 || UVar9 - UVar8 <= (U32)hSmall) break;
            UVar10 = MEM_read32(local_d40);
            UVar12 = MEM_read32(anchor);
            if (UVar10 != UVar12) break;
            local_d50 = pBVar16;
            if (uVar15 < local_a70) {
              local_d50 = pBVar20;
            }
            sVar24 = ZSTD_count_2segments(anchor + 4,local_d40 + 4,pBVar16,local_d50,pBVar18);
            hSmall._0_4_ = hSmall._4_4_;
            hSmall._4_4_ = uVar13;
            if (pBVar16 + -0x20 < anchor) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor,anchor,pBVar16 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar24 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            litLimit_w_8._0_2_ = (U16)(sVar24 + 1);
            seqStore->sequences->matchLength = (U16)litLimit_w_8;
            seqStore->sequences = seqStore->sequences + 1;
            switch(mls) {
            default:
              local_880 = ZSTD_hash4Ptr(anchor,UVar2);
              break;
            case 5:
              local_880 = ZSTD_hash5Ptr(anchor,UVar2);
              break;
            case 6:
              local_880 = ZSTD_hash6Ptr(anchor,UVar2);
              break;
            case 7:
              local_880 = ZSTD_hash7Ptr(anchor,UVar2);
              break;
            case 8:
              local_880 = ZSTD_hash8Ptr(anchor,UVar2);
            }
            pUVar4[local_880] = UVar9;
            sVar25 = ZSTD_hash8Ptr(anchor,UVar1);
            pUVar3[sVar25] = UVar9;
          }
        }
      }
      goto LAB_0026daa5;
    }
    *rep = hSmall._4_4_;
    rep[1] = (U32)hSmall;
    ms_local = (ZSTD_matchState_t *)(pBVar16 + -(long)iend);
  }
  return (size_t)ms_local;
}

Assistant:

static size_t ZSTD_compressBlock_doubleFast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize,
        U32 const mls /* template */)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32* const hashLong = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const BYTE* const base = ms->window.base;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = (dictLimit > lowLimit) ? dictLimit : lowLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_doubleFast_extDict_generic (srcSize=%zu)", srcSize);

    /* if extDict is invalidated due to maxDistance, switch to "regular" variant */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, mls, ZSTD_noDict);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t hSmall = ZSTD_hashPtr(ip, hBitsS, mls);
        const U32 matchIndex = hashSmall[hSmall];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE* match = matchBase + matchIndex;

        const size_t hLong = ZSTD_hashPtr(ip, hBitsL, 8);
        const U32 matchLongIndex = hashLong[hLong];
        const BYTE* const matchLongBase = matchLongIndex < prefixStartIndex ? dictBase : base;
        const BYTE* matchLong = matchLongBase + matchLongIndex;

        const U32 curr = (U32)(ip-base);
        const U32 repIndex = curr + 1 - offset_1;   /* offset_1 expected <= curr +1 */
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashSmall[hSmall] = hashLong[hLong] = curr;   /* update hash table */

        if ((((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow : ensure repIndex doesn't overlap dict + prefix */
            & (offset_1 < curr+1 - dictStartIndex)) /* note: we are searching at curr+1 */
          && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, 0, mLength-MINMATCH);
        } else {
            if ((matchLongIndex > dictStartIndex) && (MEM_read64(matchLong) == MEM_read64(ip))) {
                const BYTE* const matchEnd = matchLongIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchLongIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+8, matchLong+8, iend, matchEnd, prefixStart) + 8;
                offset = curr - matchLongIndex;
                while (((ip>anchor) & (matchLong>lowMatchPtr)) && (ip[-1] == matchLong[-1])) { ip--; matchLong--; mLength++; }   /* catch up */
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else if ((matchIndex > dictStartIndex) && (MEM_read32(match) == MEM_read32(ip))) {
                size_t const h3 = ZSTD_hashPtr(ip+1, hBitsL, 8);
                U32 const matchIndex3 = hashLong[h3];
                const BYTE* const match3Base = matchIndex3 < prefixStartIndex ? dictBase : base;
                const BYTE* match3 = match3Base + matchIndex3;
                U32 offset;
                hashLong[h3] = curr + 1;
                if ( (matchIndex3 > dictStartIndex) && (MEM_read64(match3) == MEM_read64(ip+1)) ) {
                    const BYTE* const matchEnd = matchIndex3 < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex3 < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+9, match3+8, iend, matchEnd, prefixStart) + 8;
                    ip++;
                    offset = curr+1 - matchIndex3;
                    while (((ip>anchor) & (match3>lowMatchPtr)) && (ip[-1] == match3[-1])) { ip--; match3--; mLength++; } /* catch up */
                } else {
                    const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                    offset = curr - matchIndex;
                    while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                }
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else {
                ip += ((ip-anchor) >> kSearchStrength) + 1;
                continue;
        }   }

        /* move to next sequence start */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Complementary insertion */
            /* done after iLimit test, as candidates could be > iend-8 */
            {   U32 const indexToInsert = curr+2;
                hashLong[ZSTD_hashPtr(base+indexToInsert, hBitsL, 8)] = indexToInsert;
                hashLong[ZSTD_hashPtr(ip-2, hBitsL, 8)] = (U32)(ip-2-base);
                hashSmall[ZSTD_hashPtr(base+indexToInsert, hBitsS, mls)] = indexToInsert;
                hashSmall[ZSTD_hashPtr(ip-1, hBitsS, mls)] = (U32)(ip-1-base);
            }

            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3)   /* intentional overflow : ensure repIndex2 doesn't overlap dict + prefix */
                    & (offset_2 < current2 - dictStartIndex))
                  && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, iend, 0, repLength2-MINMATCH);
                    hashSmall[ZSTD_hashPtr(ip, hBitsS, mls)] = current2;
                    hashLong[ZSTD_hashPtr(ip, hBitsL, 8)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}